

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::computeHidden(Model *this,vector<int,_std::allocator<int>_> *input,State *state)

{
  bool bVar1;
  const_iterator this_00;
  element_type *i;
  size_type sVar2;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  Matrix *in_RDI;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  const_iterator it;
  Vector *hidden;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffb0;
  Vector *in_stack_ffffffffffffffc0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  long local_20;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_20 = in_RDX + 0x10;
  local_10 = in_RSI;
  Vector::zero(in_stack_ffffffffffffffc0);
  local_28._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::cbegin(in_stack_ffffffffffffffa8);
  while( true ) {
    this_00 = std::vector<int,_std::allocator<int>_>::cend(in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffb0,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffa8);
    auVar3 = in_ZMM0._0_16_;
    if (!bVar1) break;
    i = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*(in_stack_ffffffffffffffb0);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              (&local_28);
    Vector::addRow((Vector *)this_00._M_current,in_RDI,(int64_t)i);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_28);
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size(local_10);
  vcvtusi2sd_avx512f(auVar3,sVar2);
  Vector::mul((Vector *)this_00._M_current,(real)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void Model::computeHidden(const std::vector<int32_t>& input, State& state)
    const {
  Vector& hidden = state.hidden;
  hidden.zero();
  for (auto it = input.cbegin(); it != input.cend(); ++it) {
    hidden.addRow(*wi_, *it);
  }
  hidden.mul(1.0 / input.size());
}